

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgnrwll(fitsfile *fptr,LONGLONG *nrows,int *status)

{
  int iVar1;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_001803d0;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    *status = 0xeb;
    return 0xeb;
  }
  *nrows = fptr->Fptr->numrows;
LAB_001803d0:
  return *status;
}

Assistant:

int ffgnrwll( fitsfile *fptr,  /* I - FITS file pointer                     */
            LONGLONG  *nrows,  /* O - number of rows in the table           */
            int  *status)      /* IO - error status                         */
/*
  Get the number of rows in the table (= NAXIS2 keyword)
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
        return(*status = NOT_TABLE);

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    *nrows = (fptr->Fptr)->numrows;

    return(*status);
}